

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void arima_summary(arima_object obj)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int t;
  int pq;
  int i;
  arima_object obj_local;
  
  iVar2 = obj->p + obj->q + obj->M;
  if ((obj->method == 0) || (obj->method == 1)) {
    printf("\n\nExit Status \n");
    printf("Return Code : %d \n",(ulong)(uint)obj->retval);
    printf("Exit Message : ");
    if (obj->retval == 0) {
      printf("Input Error");
    }
    else if (obj->retval == 1) {
      printf("Probable Success");
    }
    else if (obj->retval == 4) {
      printf("Optimization Routine didn\'t converge");
    }
    else if (obj->retval == 0xf) {
      printf("Optimization Routine Encountered Inf/Nan Values");
    }
  }
  printf("\n\n");
  printf(" ARIMA Order : ( %d, %d, %d) \n",(ulong)(uint)obj->p,(ulong)(uint)obj->d,
         (ulong)(uint)obj->q);
  printf("\n");
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  for (t = 0; t < obj->p; t = t + 1) {
    dVar1 = obj->phi[t];
    sqrt(obj->vcov[t + iVar2 * t]);
    printf("AR%-15d%-20g%-20g \n",dVar1,(ulong)(t + 1));
  }
  for (t = 0; t < obj->q; t = t + 1) {
    iVar3 = obj->p + t;
    dVar1 = obj->theta[t];
    sqrt(obj->vcov[iVar3 + iVar2 * iVar3]);
    printf("MA%-15d%-20g%-20g \n",dVar1,(ulong)(t + 1));
  }
  printf("\n");
  iVar3 = obj->p + obj->q;
  if (obj->M == 1) {
    dVar1 = obj->mean;
    sqrt(obj->vcov[iVar3 + iVar2 * iVar3]);
    printf("%-17s%-20g%-20g \n",dVar1,"MEAN");
  }
  else {
    printf("%-17s%-20g \n",obj->mean,"MEAN");
  }
  printf("\n");
  printf("%-17s%-20g \n",obj->var,"SIGMA^2");
  printf("\n");
  printf("ESTIMATION METHOD : ");
  if (obj->method == 0) {
    printf("MLE");
  }
  else if (obj->method == 1) {
    printf("CSS");
  }
  else if (obj->method == 2) {
    printf("BOX-JENKINS");
  }
  printf("\n\n");
  printf("OPTIMIZATION METHOD : ");
  if (obj->method == 2) {
    printf("Newton-Raphson");
  }
  else if (obj->optmethod == 0) {
    printf("Nelder-Mead");
  }
  else if (obj->optmethod == 1) {
    printf("Newton Line Search");
  }
  else if (obj->optmethod == 2) {
    printf("Newton Trust Region - Hook Step");
  }
  else if (obj->optmethod == 3) {
    printf("Newton Trust Region - Double Dog-Leg");
  }
  else if (obj->optmethod == 4) {
    printf("Conjugate Gradient");
  }
  else if (obj->optmethod == 5) {
    printf("BFGS");
  }
  else if (obj->optmethod == 6) {
    printf("L-BFGS");
  }
  else if (obj->optmethod == 7) {
    printf("BFGS More-Thuente Line Search");
  }
  printf("\n\n");
  printf("EQUATION FORM : x[t] ");
  for (t = 0; t < obj->p; t = t + 1) {
    if (obj->phi[t] <= 0.0) {
      if (obj->phi[t] <= 0.0 && obj->phi[t] != 0.0) {
        printf("+ %g*x[t - %d%s",ABS(obj->phi[t]),(ulong)(t + 1),"] ");
      }
    }
    else {
      printf("- %g*x[t - %d%s",ABS(obj->phi[t]),(ulong)(t + 1),"]");
    }
  }
  printf("=");
  if ((obj->mean != 0.0) || (NAN(obj->mean))) {
    printf(" %g +",obj->mean);
  }
  printf(" a[t] ");
  for (t = 0; t < obj->q; t = t + 1) {
    if (obj->theta[t] <= 0.0) {
      if (obj->phi[t] <= 0.0 && obj->phi[t] != 0.0) {
        printf("+ %g*a[t - %d%s",ABS(obj->theta[t]),(ulong)(t + 1),"] ");
      }
    }
    else {
      printf("- %g*a[t - %d%s",ABS(obj->theta[t]),(ulong)(t + 1),"]");
    }
  }
  printf("\n\n");
  if ((obj->method == 0) || (obj->method == 1)) {
    printf("Log Likelihood : %g ",obj->loglik);
    printf("\n\n");
  }
  else {
    printf("Log Likelihood : Unavailable ");
    printf("\n\n");
  }
  if (obj->method == 0) {
    printf("AIC criterion : %g ",obj->aic);
    printf("\n\n");
  }
  else {
    printf("AIC Criterion : Unavailable ");
    printf("\n\n");
  }
  return;
}

Assistant:

void arima_summary(arima_object obj) {
	int i, pq,t;
	pq = obj->p + obj->q + obj->M;
	if (obj->method == 0 || obj->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->retval);
		printf("Exit Message : ");

		if (obj->retval == 0) {
			printf("Input Error");
		}
		else if (obj->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf(" ARIMA Order : ( %d, %d, %d) \n", obj->p, obj->d, obj->q);
	printf("\n");
	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->phi[i],sqrt(obj->vcov[i+pq*i]));
	}
	for (i = 0; i < obj->q; ++i) {
		t = obj->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->theta[i], sqrt(obj->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->p + obj->q;
	if (obj->M == 1) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->mean, sqrt(obj->vcov[t + pq * t]));
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->mean);
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->var);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("MLE");
	}
	else if (obj->method == 1) {
		printf("CSS");
	}
	else if (obj->method == 2) {
		printf("BOX-JENKINS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	if (obj->method == 2) {
		printf("Newton-Raphson");
	}
	else {
		if (obj->optmethod == 0) {
			printf("Nelder-Mead");
		}
		else if (obj->optmethod == 1) {
			printf("Newton Line Search");
		}
		else if (obj->optmethod == 2) {
			printf("Newton Trust Region - Hook Step");
		}
		else if (obj->optmethod == 3) {
			printf("Newton Trust Region - Double Dog-Leg");
		}
		else if (obj->optmethod == 4) {
			printf("Conjugate Gradient");
		}
		else if (obj->optmethod == 5) {
			printf("BFGS");
		}
		else if (obj->optmethod == 6) {
			printf("L-BFGS");
		}
		else if (obj->optmethod == 7) {
			printf("BFGS More-Thuente Line Search");
		}
	}
	printf("\n\n");
	printf("EQUATION FORM : x[t] ");
	for (i = 0; i < obj->p; ++i) {
		if (obj->phi[i] > 0) {
			printf("- %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "] ");
		}
	}

	printf("=");
	if (obj->mean != 0.0) {
		printf(" %g +", obj->mean);
	}
	printf(" a[t] ");
	for (i = 0; i < obj->q; ++i) {
		if (obj->theta[i] > 0) {
			printf("- %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "] ");
		}
	}
	printf("\n\n");
	if (obj->method == 0 || obj->method == 1) {
		printf("Log Likelihood : %g ", obj->loglik);
		printf("\n\n");
	}
	else {
		printf("Log Likelihood : Unavailable ");
		printf("\n\n");
	}
	if (obj->method == 0) {
		printf("AIC criterion : %g ", obj->aic);
		printf("\n\n");
	}
	else {
		printf("AIC Criterion : Unavailable ");
		printf("\n\n");
	}
}